

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

string * __thiscall
pbrt::PathIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,PathIntegrator *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<int_const&,pbrt::LightSamplerHandle_const&,bool_const&>
            (__return_storage_ptr__,
             "[ PathIntegrator maxDepth: %d lightSampler: %s regularize: %s ]",&this->maxDepth,
             &this->lightSampler,&this->regularize);
  return __return_storage_ptr__;
}

Assistant:

std::string PathIntegrator::ToString() const {
    return StringPrintf("[ PathIntegrator maxDepth: %d lightSampler: %s regularize: %s ]",
                        maxDepth, lightSampler, regularize);
}